

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_geninfo.c
# Opt level: O3

mpt_metatype * mpt_meta_geninfo(size_t post)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  mpt_metatype *__ptr;
  
  uVar1 = _mpt_geninfo_size(post + 1);
  if (uVar1 < 0x100) {
    __ptr = (mpt_metatype *)malloc((long)(int)uVar1 + 8);
    if (__ptr != (mpt_metatype *)0x0) {
      iVar2 = _mpt_geninfo_init(__ptr + 1,(long)(int)uVar1);
      if (-1 < iVar2) {
        __ptr->_vptr = &mpt_meta_geninfo::_vptr_control;
        return __ptr;
      }
      free(__ptr);
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
  }
  return (mpt_metatype *)0x0;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_meta_geninfo(size_t post)
{
	static const MPT_INTERFACE_VPTR(metatype) _vptr_control = {
		{ metaConv },
		metaUnref,
		metaRef,
		metaClone
	};
	MPT_INTERFACE(metatype) *mt;
	
	post = _mpt_geninfo_size(post + 1);
	if (post > UINT8_MAX) {
		errno = EINVAL;
		return 0;
	}
	if (!(mt = malloc(sizeof(*mt) + post))) {
		return 0;
	}
	/* initial settings */
	if (_mpt_geninfo_init(mt + 1, post) < 0) {
		free(mt);
		return 0;
	}
	mt->_vptr = &_vptr_control;
	
	return mt;
}